

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzhamtest.cpp
# Opt level: O1

bool find_files(string *pathname,string *filename,string_array *files,bool recursive)

{
  char *__s;
  byte *pbVar1;
  byte bVar2;
  bool bVar3;
  DIR *__dirp;
  dirent64 *pdVar4;
  size_t sVar5;
  undefined1 recursive_00;
  pointer pcVar6;
  pointer pcVar7;
  string_array *files_00;
  pointer pcVar8;
  bool bVar9;
  string filename_1;
  string_array paths;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pcVar6 = (pointer)(ulong)recursive;
  if (pathname->_M_string_length != 0) {
    pcVar6 = (pathname->_M_dataplus)._M_p;
    pbVar1 = (byte *)(pcVar6 + (pathname->_M_string_length - 1));
    if ((0x2d < *pbVar1 - 0x2f) ||
       (pcVar6 = (pointer)0x200000000801,
       (0x200000000801U >> ((ulong)(*pbVar1 - 0x2f) & 0x3f) & 1) == 0)) {
      std::__cxx11::string::append((char *)pathname);
    }
  }
  __dirp = opendir((pathname->_M_dataplus)._M_p);
  if (__dirp == (DIR *)0x0) {
    bVar9 = false;
  }
  else {
    local_88.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_88.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_88.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    do {
      pdVar4 = readdir64(__dirp);
      if (pdVar4 == (dirent64 *)0x0) break;
      if (pdVar4->d_name[0] != '.') {
        bVar2 = pdVar4->d_type;
        __s = pdVar4->d_name;
        local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
        sVar5 = strlen(__s);
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,__s,__s + sVar5);
        if ((bVar2 & 4) == 0) {
          if ((bVar2 & 8) != 0) {
            std::operator+(&local_70,pathname,&local_a8);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)filename
                       ,&local_70);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_dataplus._M_p != &local_70.field_2) {
              operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
            }
          }
        }
        else {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&local_88,&local_a8);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
          operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
        }
      }
    } while (pdVar4 != (dirent64 *)0x0);
    closedir(__dirp);
    bVar9 = local_88.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            local_88.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
    if (!bVar9) {
      pcVar7 = (pointer)0x0;
      pcVar8 = (pointer)0x1;
      do {
        recursive_00 = SUB81(pcVar6,0);
        std::operator+(&local_50,pathname,
                       local_88.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + (long)pcVar7);
        bVar3 = find_files(&local_50,filename,files_00,(bool)recursive_00);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        if (!bVar3) break;
        pcVar6 = (pointer)((long)local_88.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_88.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 5);
        bVar9 = pcVar6 <= pcVar8;
        bVar3 = pcVar8 < pcVar6;
        pcVar7 = pcVar8;
        pcVar8 = (pointer)(ulong)((int)pcVar8 + 1);
      } while (bVar3);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_88);
  }
  return bVar9;
}

Assistant:

static bool find_files(std::string pathname, const std::string &filename, string_array &files, bool recursive)
{
   if (!pathname.empty())
   {
      char c = pathname[pathname.size() - 1];
      if ((c != ':') && (c != '\\') && (c != '/'))
         pathname += "/";
   }

   DIR *dp = opendir(pathname.c_str());

   if (!dp)
      return false;

   string_array paths;

   for ( ; ; )
   {
      struct dirent *ep = readdir(dp);
      if (!ep)
         break;

      const bool is_directory = (ep->d_type & DT_DIR) != 0;
      const bool is_file =  (ep->d_type & DT_REG) != 0;

      if (ep->d_name[0] == '.')
         continue;

      std::string filename(ep->d_name);

      if (is_directory)
      {
         if (recursive)
            paths.push_back(filename);
      }
      else if (is_file)
         files.push_back(pathname + filename);
   }

   closedir(dp);
   dp = NULL;

   if (recursive)
   {
      for (uint i = 0; i < paths.size(); i++)
      {
         const std::string &path = paths[i];
         if (!find_files(pathname + path, filename, files, true))
            return false;
      }
   }

   return true;
}